

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O2

U32 ZSTD_btGetAllMatches_noDict_5
              (ZSTD_match_t *matches,ZSTD_matchState_t *ms,U32 *nextToUpdate3,BYTE *ip,
              BYTE *iHighLimit,U32 *rep,U32 ll0,U32 lengthToBeat)

{
  uint uVar1;
  uint uVar2;
  U32 UVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  uint *puVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  U32 UVar16;
  U32 UVar17;
  BYTE *pBVar18;
  ulong uVar19;
  uint uVar20;
  uint local_d4;
  uint *local_d0;
  uint *local_c8;
  uint local_b4;
  ulong local_98;
  uint local_64;
  ZSTD_match_t *local_60;
  U32 *local_58;
  ulong local_50;
  BYTE *local_48;
  U32 *local_40;
  BYTE *local_38;
  
  local_60 = matches;
  if ((ms->cParams).minMatch != 5) {
    __assert_fail("BOUNDED(3, ms->cParams.minMatch, 6) == mls",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x33f,
                  "U32 ZSTD_btGetAllMatches_internal(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *, const BYTE *const, const U32 *, const U32, const U32, const ZSTD_dictMode_e, const U32)"
                 );
  }
  pBVar18 = (ms->window).base;
  uVar13 = (ulong)ms->nextToUpdate;
  if (ip < pBVar18 + uVar13) {
    return 0;
  }
  while( true ) {
    uVar20 = (uint)uVar13;
    uVar4 = (uint)((long)ip - (long)pBVar18);
    if (uVar4 <= uVar20) break;
    UVar3 = ZSTD_insertBt1(ms,pBVar18 + uVar13,iHighLimit,uVar4,5,0);
    uVar13 = (ulong)(UVar3 + uVar20);
    if (UVar3 + uVar20 <= uVar20) {
      __assert_fail("idx < (U32)(idx + forward)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x236,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
  }
  if ((ulong)((long)ip - (long)pBVar18) >> 0x20 != 0) {
    __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x239,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if ((ulong)((long)iHighLimit - (long)pBVar18) >> 0x20 != 0) {
    __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x23a,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  ms->nextToUpdate = uVar4;
  uVar4 = (ms->cParams).targetLength;
  uVar20 = 0xfff;
  if (uVar4 < 0xfff) {
    uVar20 = uVar4;
  }
  uVar4 = (ms->cParams).hashLog;
  if (0x20 < uVar4) {
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  local_50 = (ulong)(*(long *)ip * -0x30e4432345000000) >> (-(char)uVar4 & 0x3fU);
  local_38 = (ms->window).base;
  uVar15 = (int)ip - (int)local_38;
  uVar14 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar13 = 0;
  uVar4 = uVar15 - uVar14;
  if (uVar15 < uVar14) {
    uVar4 = 0;
  }
  UVar3 = (ms->window).lowLimit;
  UVar17 = 1;
  uVar12 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  UVar16 = uVar15 - uVar12;
  if (uVar15 - UVar3 <= uVar12) {
    UVar16 = UVar3;
  }
  if (ms->loadedDictEnd != 0) {
    UVar16 = UVar3;
  }
  uVar12 = (ms->cParams).searchLog;
  if (1 < ll0) {
    __assert_fail("ll0 <= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x27a,
                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                 );
  }
  local_58 = ms->hashTable;
  uVar1 = local_58[local_50];
  local_40 = ms->chainTable;
  uVar2 = (ms->window).dictLimit;
  uVar19 = (ulong)((uVar14 & uVar15) * 2);
  local_c8 = local_40 + uVar19;
  local_d0 = local_40 + uVar19 + 1;
  local_d4 = uVar15 + 9;
  local_98 = (ulong)(lengthToBeat - 1);
  local_48 = ip + 4;
  for (uVar19 = (ulong)ll0; ll0 + 3 != uVar19; uVar19 = uVar19 + 1) {
    if (uVar19 == 3) {
      uVar10 = *rep - 1;
    }
    else {
      uVar10 = rep[uVar19];
    }
    if (uVar15 < uVar2) {
      __assert_fail("curr >= dictLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x281,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    if (uVar10 - 1 < uVar15 - uVar2) {
      uVar5 = 0;
      if ((UVar16 <= uVar15 - uVar10) && (uVar5 = 0, *(int *)ip == *(int *)(ip + -(ulong)uVar10))) {
        sVar7 = ZSTD_count(local_48,local_48 + -(ulong)uVar10,iHighLimit);
        uVar5 = (int)sVar7 + 4;
      }
    }
    else {
      uVar5 = 0;
      if (uVar15 < UVar16) {
        __assert_fail("curr >= windowLow",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x28d,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
    }
    uVar11 = (ulong)uVar5;
    if (local_98 < uVar11) {
      local_60[uVar13].off = UVar17;
      local_60[uVar13].len = uVar5;
      uVar10 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar10;
      if (uVar20 < uVar5) {
        return uVar10;
      }
      local_98 = uVar11;
      if (ip + uVar11 == iHighLimit) {
        return uVar10;
      }
    }
    UVar17 = UVar17 + 1;
  }
  local_58[local_50] = uVar15;
  uVar19 = 0;
  uVar11 = 0;
  local_b4 = 1 << ((byte)uVar12 & 0x1f);
  do {
    UVar3 = (U32)uVar13;
    if ((local_b4 == 0) || (uVar1 < UVar16 + (UVar16 == 0))) goto LAB_001ec917;
    uVar8 = uVar19;
    if (uVar11 < uVar19) {
      uVar8 = uVar11;
    }
    if (uVar15 <= uVar1) {
      __assert_fail("curr > matchIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x2cd,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    if (uVar1 + uVar8 < (ulong)uVar2) {
      __assert_fail("matchIndex+matchLength >= dictLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x2d0,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    pBVar18 = local_38 + uVar1;
    if ((uVar2 <= uVar1) && (iVar6 = bcmp(pBVar18,ip,uVar8), iVar6 != 0)) {
      __assert_fail("memcmp(match, ip, matchLength) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x2d2,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    sVar7 = ZSTD_count(ip + uVar8,pBVar18 + uVar8,iHighLimit);
    uVar8 = sVar7 + uVar8;
    if (local_98 < uVar8) {
      if (local_d4 < uVar1 || local_d4 - uVar1 == 0) {
        __assert_fail("matchEndIdx > matchIndex",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x2df,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if (local_d4 - uVar1 < uVar8) {
        local_d4 = uVar1 + (U32)uVar8;
      }
      local_60[uVar13].off = (uVar15 + 3) - uVar1;
      local_60[uVar13].len = (U32)uVar8;
      UVar3 = UVar3 + 1;
      uVar13 = (ulong)UVar3;
      if ((0x1000 < uVar8) || (local_98 = uVar8, ip + uVar8 == iHighLimit)) goto LAB_001ec917;
    }
    UVar3 = (U32)uVar13;
    puVar9 = local_40 + (uVar1 & uVar14) * 2;
    if (pBVar18[uVar8] < ip[uVar8]) {
      *local_c8 = uVar1;
      if (uVar1 <= uVar4) {
        local_c8 = &local_64;
LAB_001ec917:
        *local_d0 = 0;
        *local_c8 = 0;
        if (0x40000000 < local_b4) {
          __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0x2fd,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        if (uVar15 + 8 < local_d4) {
          ms->nextToUpdate = local_d4 - 8;
          return UVar3;
        }
        __assert_fail("matchEndIdx > curr+8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x324,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      puVar9 = puVar9 + 1;
      uVar11 = uVar8;
      local_c8 = puVar9;
    }
    else {
      *local_d0 = uVar1;
      local_d0 = puVar9;
      uVar19 = uVar8;
      if (uVar1 <= uVar4) {
        local_d0 = &local_64;
        goto LAB_001ec917;
      }
    }
    uVar1 = *puVar9;
    local_b4 = local_b4 - 1;
  } while( true );
}

Assistant:

GEN_ZSTD_BT_GET_ALL_MATCHES(noDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(extDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(dictMatchState)

#define ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMode)  \
    {                                            \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 3), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 4), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 5), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 6)  \
    }

static ZSTD_getAllMatchesFn
ZSTD_selectBtGetAllMatches(ZSTD_matchState_t const* ms, ZSTD_dictMode_e const dictMode)
{
    ZSTD_getAllMatchesFn const getAllMatchesFns[3][4] = {
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(noDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(extDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMatchState)
    };
    U32 const mls = BOUNDED(3, ms->cParams.minMatch, 6);
    assert((U32)dictMode < 3);
    assert(mls - 3 < 4);
    return getAllMatchesFns[(int)dictMode][mls - 3];
}

/*************************
*  LDM helper functions  *
*************************/

/* Struct containing info needed to make decision about ldm inclusion */
typedef struct {
    rawSeqStore_t seqStore;   /* External match candidates store for this block */
    U32 startPosInBlock;      /* Start position of the current match candidate */
    U32 endPosInBlock;        /* End position of the current match candidate */
    U32 offset;               /* Offset of the match candidate */
} ZSTD_optLdm_t;

/* ZSTD_optLdm_skipRawSeqStoreBytes():
 * Moves forward in @rawSeqStore by @nbBytes,
 * which will update the fields 'pos' and 'posInSequence'.
 */
static void ZSTD_optLdm_skipRawSeqStoreBytes(rawSeqStore_t* rawSeqStore, size_t nbBytes)
{
    U32 currPos = (U32)(rawSeqStore->posInSequence + nbBytes);
    while (currPos && rawSeqStore->pos < rawSeqStore->size) {
        rawSeq currSeq = rawSeqStore->seq[rawSeqStore->pos];
        if (currPos >= currSeq.litLength + currSeq.matchLength) {
            currPos -= currSeq.litLength + currSeq.matchLength;
            rawSeqStore->pos++;
        } else {
            rawSeqStore->posInSequence = currPos;
            break;
        }
    }
    if (currPos == 0 || rawSeqStore->pos == rawSeqStore->size) {
        rawSeqStore->posInSequence = 0;
    }
}